

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

int disas_neon_insn_3same_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  bool bVar1;
  code *fn;
  TCGv_ptr ptr;
  uint uVar2;
  ARMISARegisters *pAVar3;
  uint uVar4;
  byte bVar5;
  code *fn_00;
  uint uVar6;
  uint data;
  uint32_t oprsz;
  uint uVar7;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((insn & 0xfe200f10) == 0xfc200800) {
    pAVar3 = s->isar;
    if (pAVar3->id_isar5 < 0x10000000) {
      return 1;
    }
    data = insn >> 0x17 & 3;
    if ((insn >> 0x14 & 1) == 0) {
      if ((pAVar3->id_aa64pfr0 & 0xf0000) != 0x10000) {
        return 1;
      }
      fn_00 = gen_helper_gvec_fcmlah;
    }
    else {
      fn_00 = gen_helper_gvec_fcmlas;
    }
LAB_00648cde:
    bVar5 = 0;
  }
  else {
    if ((insn & 0xfea00f10) == 0xfc800800) {
      pAVar3 = s->isar;
      if (pAVar3->id_isar5 < 0x10000000) {
        return 1;
      }
      data = insn >> 0x18 & 1;
      if ((insn >> 0x14 & 1) == 0) {
        if ((pAVar3->id_aa64pfr0 & 0xf0000) != 0x10000) {
          return 1;
        }
        fn_00 = gen_helper_gvec_fcaddh;
      }
      else {
        fn_00 = gen_helper_gvec_fcadds;
      }
      goto LAB_00648cde;
    }
    if ((insn & 0xfeb00f00) == 0xfc200d00) {
      pAVar3 = s->isar;
      fn = gen_helper_gvec_udot_b;
      if ((insn & 0x10) == 0) {
        fn = gen_helper_gvec_sdot_b;
      }
      if ((pAVar3->id_isar6 & 0xf0) == 0) {
        return 1;
      }
      data = 0;
      bVar1 = true;
      bVar5 = 0;
      fn_00 = (code *)0x0;
      goto LAB_00648ce5;
    }
    if ((insn & 0xff300f10) != 0xfc200810) {
      return 1;
    }
    pAVar3 = s->isar;
    if ((pAVar3->id_isar6 & 0xf00) == 0) {
      return 1;
    }
    data = insn >> 0x17 & 1;
    fn_00 = gen_helper_gvec_fmlal_a32;
    bVar5 = 1;
  }
  bVar1 = false;
  fn = (gen_helper_gvec_3_conflict1 *)0x0;
LAB_00648ce5:
  if ((pAVar3->mvfr0 & 0xe) == 0) {
    if ((insn >> 0x16 & 1) != 0) {
      return 1;
    }
    uVar7 = insn >> 0xc & 0xf;
  }
  else {
    uVar7 = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  }
  uVar2 = insn & 0x40;
  if ((uVar7 & uVar2 >> 6) != 0) {
    return 1;
  }
  if ((uVar2 == 0) && (bVar5 != 0)) {
    uVar6 = (insn >> 9 & 0x700) + (insn >> 7 & 1 | insn >> 0xf & 2) * 4;
    uVar4 = (insn << 3 | insn >> 3) & 0xc | (insn & 0xe) << 7;
  }
  else {
    if ((pAVar3->mvfr0 & 0xe) == 0) {
      if ((insn & 0xa0) != 0) {
        return 1;
      }
      uVar6 = insn >> 0x10 & 0xf;
      uVar4 = insn & 0xf;
    }
    else {
      uVar6 = insn >> 3 & 0x10 | insn >> 0x10 & 0xf;
      uVar4 = insn >> 1 & 0x10 | insn & 0xf;
    }
    if (((uint)(byte)~bVar5 & (uVar4 | uVar6) & uVar2 >> 6) != 0) {
      return 1;
    }
    uVar6 = (uVar6 << 3 | uVar6 << 7) & 0xf08;
    uVar4 = (uVar4 << 3 | uVar4 << 7) & 0xf08;
  }
  if (s->fp_excp_el == 0) {
    if (s->vfp_enabled != true) {
      return 1;
    }
    oprsz = (uint)(uVar2 != 0) * 8 + 8;
    if (!bVar1) {
      if (bVar5 == 0) {
        ptr = get_fpstatus_ptr_aarch64(tcg_ctx,1);
      }
      else {
        ptr = tcg_ctx->cpu_env;
      }
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,((uVar7 << 3 | uVar7 << 7) & 0xf08) + 0xc10,uVar6 + 0xc10,uVar4 + 0xc10,ptr
                 ,oprsz,oprsz,data,fn_00);
      if (bVar5 != 0) {
        return 0;
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
      return 0;
    }
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx,((uVar7 << 3 | uVar7 << 7) & 0xf08) + 0xc10,uVar6 + 0xc10,uVar4 + 0xc10,oprsz
               ,oprsz,data,fn);
  }
  else {
    gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x1fe00020,s->fp_excp_el);
  }
  return 0;
}

Assistant:

static int disas_neon_insn_3same_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_3 *fn_gvec = NULL;
    gen_helper_gvec_3_ptr *fn_gvec_ptr = NULL;
    int rd, rn, rm, opr_sz;
    int data = 0;
    int off_rn, off_rm;
    bool is_long = false, q = extract32(insn, 6, 1);
    bool ptr_is_env = false;

    if ((insn & 0xfe200f10) == 0xfc200800) {
        /* VCMLA -- 1111 110R R.1S .... .... 1000 ...0 .... */
        int size = extract32(insn, 20, 1);
        data = extract32(insn, 23, 2); /* rot */
        if (!dc_isar_feature(aa32_vcma, s)
            || (!size && !dc_isar_feature(aa32_fp16_arith, s))) {
            return 1;
        }
        fn_gvec_ptr = size ? gen_helper_gvec_fcmlas : gen_helper_gvec_fcmlah;
    } else if ((insn & 0xfea00f10) == 0xfc800800) {
        /* VCADD -- 1111 110R 1.0S .... .... 1000 ...0 .... */
        int size = extract32(insn, 20, 1);
        data = extract32(insn, 24, 1); /* rot */
        if (!dc_isar_feature(aa32_vcma, s)
            || (!size && !dc_isar_feature(aa32_fp16_arith, s))) {
            return 1;
        }
        fn_gvec_ptr = size ? gen_helper_gvec_fcadds : gen_helper_gvec_fcaddh;
    } else if ((insn & 0xfeb00f00) == 0xfc200d00) {
        /* V[US]DOT -- 1111 1100 0.10 .... .... 1101 .Q.U .... */
        bool u = extract32(insn, 4, 1);
        if (!dc_isar_feature(aa32_dp, s)) {
            return 1;
        }
        fn_gvec = u ? gen_helper_gvec_udot_b : gen_helper_gvec_sdot_b;
    } else if ((insn & 0xff300f10) == 0xfc200810) {
        /* VFM[AS]L -- 1111 1100 S.10 .... .... 1000 .Q.1 .... */
        int is_s = extract32(insn, 23, 1);
        if (!dc_isar_feature(aa32_fhm, s)) {
            return 1;
        }
        is_long = true;
        data = is_s; /* is_2 == 0 */
        fn_gvec_ptr = gen_helper_gvec_fmlal_a32;
        ptr_is_env = true;
    } else {
        return 1;
    }

    VFP_DREG_D(rd, insn);
    if (rd & q) {
        return 1;
    }
    if (q || !is_long) {
        VFP_DREG_N(rn, insn);
        VFP_DREG_M(rm, insn);
        if ((rn | rm) & q & !is_long) {
            return 1;
        }
        off_rn = vfp_reg_offset(1, rn);
        off_rm = vfp_reg_offset(1, rm);
    } else {
        rn = VFP_SREG_N(insn);
        rm = VFP_SREG_M(insn);
        off_rn = vfp_reg_offset(0, rn);
        off_rm = vfp_reg_offset(0, rm);
    }

    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }
    if (!s->vfp_enabled) {
        return 1;
    }

    opr_sz = (1 + q) * 8;
    if (fn_gvec_ptr) {
        TCGv_ptr ptr;
        if (ptr_is_env) {
            ptr = tcg_ctx->cpu_env;
        } else {
            ptr = get_fpstatus_ptr(tcg_ctx, 1);
        }
        tcg_gen_gvec_3_ptr(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm, ptr,
                           opr_sz, opr_sz, data, fn_gvec_ptr);
        if (!ptr_is_env) {
            tcg_temp_free_ptr(tcg_ctx, ptr);
        }
    } else {
        tcg_gen_gvec_3_ool(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm,
                           opr_sz, opr_sz, data, fn_gvec);
    }
    return 0;
}